

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall soul::StructuralParser::parseFunctionOrStateVariable(StructuralParser *this)

{
  ModuleBase *pMVar1;
  undefined8 uVar2;
  Ptr PVar3;
  bool isExternal;
  bool bVar4;
  int iVar5;
  Identifier name;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *location;
  pool_ptr<soul::AST::Expression> type;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  genericWildcards;
  Context declarationContext;
  Context context;
  undefined1 local_1a0 [16];
  UTF8Reader UStack_190;
  Ptr local_188;
  Context local_180;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  Scope *pSStack_140;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_138;
  Context local_120;
  CompileMessage local_108;
  CompileMessage local_d0;
  CompileMessage local_98;
  CompileMessage local_60;
  
  local_180.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_180.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_180.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_180.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_180.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_180.parentScope = this->currentScope;
  isExternal = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
               ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2892e3);
  bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,"static_assert");
  if (bVar4) {
    parseStaticAssert(this);
  }
  else {
    tryParsingType((StructuralParser *)local_1a0,(ParseTypeContext)this);
    if ((Expression *)local_1a0._0_8_ == (Expression *)0x0) {
      CompileMessageHelpers::createMessage<>
                (&local_60,syntax,error,"Expected a function or variable declaration");
      AST::Context::throwError(&local_180,&local_60,false);
    }
    local_150._M_allocated_capacity =
         (size_type)(this->super_SOULTokeniser).location.sourceCode.object;
    if ((SourceCodeText *)local_150._M_allocated_capacity != (SourceCodeText *)0x0) {
      (((SourceCodeText *)local_150._M_allocated_capacity)->super_RefCountedObject).refCount =
           (((SourceCodeText *)local_150._M_allocated_capacity)->super_RefCountedObject).refCount +
           1;
    }
    local_150._8_8_ = (this->super_SOULTokeniser).location.location.data;
    pSStack_140 = this->currentScope;
    name = parseIdentifier(this);
    local_1a0._8_8_ = (Function *)0x0;
    UStack_190.data = (char *)0x0;
    local_188.object = (SourceCodeText *)0x0;
    bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d5e);
    if (bVar4) {
      parseGenericFunctionWildcardList(&local_168,this);
      PVar3.object = local_188.object;
      uVar2 = local_1a0._8_8_;
      local_1a0._8_8_ =
           local_168.
           super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      UStack_190.data =
           (char *)local_168.
                   super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      local_188.object =
           (SourceCodeText *)
           local_168.
           super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_168.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((Function *)uVar2 != (Function *)0x0) {
        operator_delete((void *)uVar2,(long)PVar3.object - uVar2);
      }
      if ((Function *)
          local_168.
          super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Function *)0x0) {
        operator_delete(local_168.
                        super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2af3de);
    if (bVar4) {
      if (isExternal) {
        CompileMessageHelpers::createMessage<>
                  (&local_98,syntax,error,"A function declaration cannot be marked \'external\'");
        AST::Context::throwError(&local_180,&local_98,false);
      }
      pMVar1 = (this->module).object;
      if (pMVar1 == (ModuleBase *)0x0) {
LAB_00200732:
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      iVar5 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[0xc])();
      if ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
           *)CONCAT44(extraout_var,iVar5) ==
          (vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
           *)0x0) {
        pMVar1 = (this->module).object;
        if (pMVar1 != (ModuleBase *)0x0) {
          iVar5 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[5])();
          if ((char)iVar5 == '\0') {
            CompileMessageHelpers::createMessage<>
                      (&local_108,syntax,error,"Cannot declare a function in this scope");
          }
          else {
            CompileMessageHelpers::createMessage<>
                      (&local_108,syntax,error,
                       "Functions can only be declared inside a processor or namespace");
          }
          AST::Context::throwError(&local_180,&local_108,false);
        }
        goto LAB_00200732;
      }
      if ((Expression *)local_1a0._0_8_ == (Expression *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      std::
      vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::vector(&local_138,
               (vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                *)(local_1a0 + 8));
      local_168.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)parseFunctionDeclaration
                              (this,&local_180,(Expression *)local_1a0._0_8_,name,
                               (Context *)&local_150,&local_138);
      std::
      vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
      ::emplace_back<soul::pool_ref<soul::AST::Function>>
                ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
                  *)CONCAT44(extraout_var,iVar5),(pool_ref<soul::AST::Function> *)&local_168);
      if (local_138.
          super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.
                        super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      if (isExternal) {
        if ((Expression *)local_1a0._0_8_ == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        iVar5 = (*(((Statement *)local_1a0._0_8_)->super_ASTObject)._vptr_ASTObject[10])();
        if (iVar5 == 0) {
          CompileMessageHelpers::createMessage<>
                    (&local_d0,syntax,error,
                     "External declarations do not require the \'const\' keyword");
          AST::Context::throwError(&local_180,&local_d0,false);
        }
      }
      pMVar1 = (this->module).object;
      if (pMVar1 == (ModuleBase *)0x0) {
        iVar5 = 0x3c;
        location = "operator->";
LAB_00200756:
        throwInternalCompilerError("object != nullptr",location,iVar5);
      }
      iVar5 = (*(pMVar1->super_ASTObject)._vptr_ASTObject[0xb])();
      if ((Expression *)local_1a0._0_8_ == (Expression *)0x0) {
        iVar5 = 0x3b;
        location = "operator*";
        goto LAB_00200756;
      }
      local_120.location.sourceCode.object = (SourceCodeText *)local_150._M_allocated_capacity;
      if ((SourceCodeText *)local_150._M_allocated_capacity != (SourceCodeText *)0x0) {
        *(int *)local_150._M_allocated_capacity = *(int *)local_150._M_allocated_capacity + 1;
      }
      local_120.location.location.data = (char *)local_150._8_8_;
      local_120.parentScope = pSStack_140;
      local_168.
      super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar5);
      parseVariableDeclaration<soul::StructuralParser::parseFunctionOrStateVariable()::_lambda(soul::AST::VariableDeclaration&)_1_>
                (this,(Expression *)local_1a0._0_8_,name,isExternal,&local_120,
                 (anon_class_8_1_ee5ece24 *)&local_168);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_120.location.sourceCode.object);
    }
    if ((Function *)local_1a0._8_8_ != (Function *)0x0) {
      operator_delete((void *)local_1a0._8_8_,(long)local_188.object - local_1a0._8_8_);
    }
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull
              ((SourceCodeText *)local_150._M_allocated_capacity);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_180.location.sourceCode.object);
  return;
}

Assistant:

void parseFunctionOrStateVariable()
    {
        auto declarationContext = getContext();
        bool isExternal = matchIf (Keyword::external);

        if (matches ("static_assert"))
            return parseStaticAssert();

        auto type = tryParsingType (ParseTypeContext::variableType);

        if (type == nullptr)
            declarationContext.throwError (Errors::expectedFunctionOrVariable());

        auto context = getContext();
        auto name = parseIdentifier();

        std::vector<pool_ref<AST::UnqualifiedName>> genericWildcards;

        if (matchIf (Operator::lessThan))
            genericWildcards = parseGenericFunctionWildcardList();

        if (matchIf (Operator::openParen))
        {
            if (isExternal)
                declarationContext.throwError (Errors::functionCannotBeExternal());

            if (auto functions = module->getFunctionList())
                functions->push_back (parseFunctionDeclaration (declarationContext, *type, name, context, genericWildcards));
            else
                declarationContext.throwError (module->isGraph() ? Errors::graphCannotContainFunctions()
                                                                 : Errors::noFunctionInThisScope());
        }
        else
        {
            if (isExternal && type->getConstness() == AST::Constness::definitelyConst)
                declarationContext.throwError (Errors::noConstOnExternals());

            auto& stateVariables = module->getStateVariableList();

            parseVariableDeclaration (*type, name, isExternal, context,
                                      [&] (AST::VariableDeclaration& v)  { stateVariables.push_back (v); });
        }
    }